

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteKey
          (WalletBatch *this,CPubKey *vchPubKey,CPrivKey *vchPrivKey,CKeyMetadata *keyMeta)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  iterator in1;
  const_iterator __position;
  const_iterator __first;
  iterator this_01;
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *in_RDX;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  undefined1 uVar2;
  undefined8 in_stack_fffffffffffffe68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *key;
  CPubKey *in_stack_fffffffffffffe70;
  CKeyMetadata *in_stack_fffffffffffffe78;
  WalletBatch *in_stack_fffffffffffffe80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe88;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  in_stack_fffffffffffffea8;
  bool local_101;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_e0 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = WriteKeyMetadata(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                           in_stack_fffffffffffffe70,
                           SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe48);
    CPubKey::size((CPubKey *)in_stack_fffffffffffffe48);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe48)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (in_stack_fffffffffffffe88,(size_type)in_stack_fffffffffffffe80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe50);
    CPubKey::begin((CPubKey *)in_stack_fffffffffffffe48);
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              CPubKey::end((CPubKey *)
                           CONCAT17(in_stack_fffffffffffffe5f,
                                    CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
    in1 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<unsigned_char_const*,void>
                    (this_00,in_stack_fffffffffffffea8._M_current,(uchar *)in_stack_fffffffffffffe78
                     ,in_stack_fffffffffffffe70->vch);
    key = local_e0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe50);
    __position = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::begin
                           ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                            in_stack_fffffffffffffe50);
    __first = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffe50);
    this_01 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
              insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffe70,__position._M_current,__first._M_current,
                         in_stack_fffffffffffffea8);
    std::make_pair<std::__cxx11::string_const&,CPubKey_const&>
              (in_stack_fffffffffffffe50,(CPubKey *)in_stack_fffffffffffffe48);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in1._M_current);
    std::make_pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>const&,uint256>
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
               (uint256 *)in_stack_fffffffffffffe48);
    local_101 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                          ((WalletBatch *)this_01._M_current,key,in_RDX,
                           (bool)in_stack_fffffffffffffe5f);
    uVar2 = local_101;
    std::pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256>::~pair
              ((pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *)
               in_stack_fffffffffffffe48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>::
    ~pair(in_stack_fffffffffffffe48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  }
  else {
    local_101 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_101;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteKey(const CPubKey& vchPubKey, const CPrivKey& vchPrivKey, const CKeyMetadata& keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, false)) {
        return false;
    }

    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> vchKey;
    vchKey.reserve(vchPubKey.size() + vchPrivKey.size());
    vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
    vchKey.insert(vchKey.end(), vchPrivKey.begin(), vchPrivKey.end());

    return WriteIC(std::make_pair(DBKeys::KEY, vchPubKey), std::make_pair(vchPrivKey, Hash(vchKey)), false);
}